

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::InferColorSpace(token *tok,ColorSpace *cty)

{
  bool bVar1;
  string *psVar2;
  ColorSpace *cty_local;
  token *tok_local;
  
  if (cty == (ColorSpace *)0x0) {
    tok_local._7_1_ = false;
  }
  else {
    psVar2 = Token::str_abi_cxx11_(tok);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              psVar2,"raw");
    if (bVar1) {
      *cty = Raw;
    }
    else {
      psVar2 = Token::str_abi_cxx11_(tok);
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )psVar2,"Raw");
      if (bVar1) {
        *cty = Raw;
      }
      else {
        psVar2 = Token::str_abi_cxx11_(tok);
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)psVar2,"srgb");
        if (bVar1) {
          *cty = sRGB;
        }
        else {
          psVar2 = Token::str_abi_cxx11_(tok);
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)psVar2,"sRGB");
          if (bVar1) {
            *cty = sRGB;
          }
          else {
            psVar2 = Token::str_abi_cxx11_(tok);
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)psVar2,"linear");
            if (bVar1) {
              *cty = Lin_sRGB;
            }
            else {
              psVar2 = Token::str_abi_cxx11_(tok);
              bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)psVar2,"lin_srgb");
              if (bVar1) {
                *cty = Lin_sRGB;
              }
              else {
                psVar2 = Token::str_abi_cxx11_(tok);
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)psVar2,"rec709");
                if (bVar1) {
                  *cty = Rec709;
                }
                else {
                  psVar2 = Token::str_abi_cxx11_(tok);
                  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)psVar2,"ocio");
                  if (bVar1) {
                    *cty = OCIO;
                  }
                  else {
                    psVar2 = Token::str_abi_cxx11_(tok);
                    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)psVar2,"lin_displayp3");
                    if (bVar1) {
                      *cty = Lin_DisplayP3;
                    }
                    else {
                      psVar2 = Token::str_abi_cxx11_(tok);
                      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)psVar2,"srgb_displayp3");
                      if (bVar1) {
                        *cty = sRGB_DisplayP3;
                      }
                      else {
                        psVar2 = Token::str_abi_cxx11_(tok);
                        bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar2,"ACES - ACEScg");
                        if (bVar1) {
                          *cty = Lin_ACEScg;
                        }
                        else {
                          psVar2 = Token::str_abi_cxx11_(tok);
                          bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar2,"Input - Texture - sRGB - Display P3");
                          if (bVar1) {
                            *cty = sRGB_DisplayP3;
                          }
                          else {
                            psVar2 = Token::str_abi_cxx11_(tok);
                            bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar2,"Input - Texture - sRGB - sRGB");
                            if (bVar1) {
                              *cty = sRGB;
                            }
                            else {
                              psVar2 = Token::str_abi_cxx11_(tok);
                              bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)psVar2,"custom");
                              if (!bVar1) {
                                return false;
                              }
                              *cty = Custom;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    tok_local._7_1_ = true;
  }
  return tok_local._7_1_;
}

Assistant:

bool InferColorSpace(const value::token &tok, ColorSpace *cty) {
  if (!cty) {
    return false;
  }

  if (tok.str() == "raw") {
    (*cty) = ColorSpace::Raw;
  } else if (tok.str() == "Raw") {
    (*cty) = ColorSpace::Raw;
  } else if (tok.str() == "srgb") {
    (*cty) = ColorSpace::sRGB;
  } else if (tok.str() == "sRGB") {
    (*cty) = ColorSpace::sRGB;
  } else if (tok.str() == "linear") { // guess linear_srgb
    (*cty) = ColorSpace::Lin_sRGB;
  } else if (tok.str() == "lin_srgb") {
    (*cty) = ColorSpace::Lin_sRGB;
  } else if (tok.str() == "rec709") {
    (*cty) = ColorSpace::Rec709;
  } else if (tok.str() == "ocio") {
    (*cty) = ColorSpace::OCIO;
  } else if (tok.str() == "lin_displayp3") {
    (*cty) = ColorSpace::Lin_DisplayP3;
  } else if (tok.str() == "srgb_displayp3") {
    (*cty) = ColorSpace::sRGB_DisplayP3;

    //
    // seen in Apple's USDZ model(or OCIO?)
    //

  } else if (tok.str() == "ACES - ACEScg") {
    (*cty) = ColorSpace::Lin_ACEScg;
  } else if (tok.str() == "Input - Texture - sRGB - Display P3") {
    (*cty) = ColorSpace::sRGB_DisplayP3;
  } else if (tok.str() == "Input - Texture - sRGB - sRGB") {
    (*cty) = ColorSpace::sRGB;
  } else if (tok.str() == "custom") {
    (*cty) = ColorSpace::Custom;
  } else {
    return false;
  }

  return true;
}